

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_platform_sdl2.c
# Opt level: O1

FAudioIOStream * FAudio_memopen(void *mem,int len)

{
  undefined1 auVar1 [16];
  FAudioIOStream *pFVar2;
  void *pvVar3;
  undefined1 auVar4 [16];
  
  pFVar2 = (FAudioIOStream *)SDL_malloc(0x28);
  pvVar3 = (void *)SDL_RWFromMem(mem,len);
  pFVar2->data = pvVar3;
  auVar1 = *(undefined1 (*) [16])((long)pvVar3 + 8);
  auVar4._0_8_ = auVar1._8_8_;
  auVar4._8_4_ = auVar1._0_4_;
  auVar4._12_4_ = auVar1._4_4_;
  pFVar2->read = (FAudio_readfunc)auVar4._0_8_;
  pFVar2->seek = (FAudio_seekfunc)auVar4._8_8_;
  pFVar2->close = *(FAudio_closefunc *)((long)pvVar3 + 0x20);
  pvVar3 = (void *)SDL_CreateMutex();
  pFVar2->lock = pvVar3;
  return pFVar2;
}

Assistant:

FAudioIOStream* FAudio_memopen(void *mem, int len)
{
	FAudioIOStream *io = (FAudioIOStream*) FAudio_malloc(
		sizeof(FAudioIOStream)
	);
	SDL_RWops *rwops = SDL_RWFromMem(mem, len);
	io->data = rwops;
	io->read = (FAudio_readfunc) rwops->read;
	io->seek = (FAudio_seekfunc) rwops->seek;
	io->close = (FAudio_closefunc) rwops->close;
	io->lock = FAudio_PlatformCreateMutex();
	return io;
}